

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O2

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Dvd::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Dvd *this)

{
  TestOptions *opt;
  const_iterator __position;
  MthdDvdSrcFormat *pMVar1;
  MthdSifmDvDy *pMVar2;
  MthdSurfOffset *pMVar3;
  SingleMthdTest *pSVar4;
  MthdSifmXy *pMVar5;
  MthdDmaNotify *pMVar6;
  MthdNotify *pMVar7;
  MthdNop *pMVar8;
  result_type rVar9;
  MthdPmTrigger *this_00;
  MthdDmaGrobj *pMVar10;
  MthdDmaSurf *this_01;
  MthdSifmRect *this_02;
  MthdSifmSrcSize *pMVar11;
  MthdSifmOffset *pMVar12;
  MthdSifmDuDx *pMVar13;
  MthdSifmSrcPos *pMVar14;
  MthdSync *this_03;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar15;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_00;
  uint32_t uVar16;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this_04;
  allocator_type local_490;
  allocator local_48f;
  allocator local_48e;
  allocator local_48d;
  allocator local_48c;
  allocator local_48b;
  allocator local_48a;
  allocator local_489;
  allocator local_488;
  allocator local_487;
  allocator local_486;
  allocator local_485;
  allocator local_484;
  allocator local_483;
  allocator local_482;
  allocator local_481;
  allocator local_480;
  allocator local_47f;
  allocator local_47e;
  allocator local_47d;
  allocator local_47c;
  allocator local_47b;
  allocator local_47a;
  allocator local_479;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_478;
  MthdDvdSrcFormat *local_470;
  MthdSifmDvDy *local_468;
  MthdSifmSrcPos *local_460;
  MthdDvdSrcFormat *local_458;
  MthdSifmDvDy *local_450;
  MthdSifmDuDx *local_448;
  MthdSurfOffset *local_440;
  SingleMthdTest *local_438;
  MthdSifmXy *local_430;
  MthdDmaGrobj *local_428;
  MthdDmaNotify *local_420;
  MthdNotify *local_418;
  MthdNop *local_410;
  MthdSifmSrcSize *local_408;
  MthdSifmDuDx *local_400;
  MthdSifmOffset *local_3f8;
  MthdSifmSrcSize *local_3f0;
  MthdSifmRect *local_3e8;
  MthdDmaSurf *local_3e0;
  MthdDmaGrobj *local_3d8;
  MthdPmTrigger *local_3d0;
  string local_3c8;
  string local_3a8;
  string local_388;
  MthdDmaGrobj *local_368;
  MthdDmaGrobj *local_360;
  MthdDmaSurf *local_358;
  MthdSifmXy *local_350;
  MthdSifmRect *local_348;
  SingleMthdTest *local_340;
  MthdSurfOffset *local_338;
  MthdSifmDuDx *local_330;
  MthdSifmDvDy *local_328;
  MthdSifmSrcSize *local_320;
  MthdDvdSrcFormat *local_318;
  MthdSifmOffset *local_310;
  MthdSifmSrcPos *local_308;
  MthdSifmDuDx *local_300;
  MthdSifmDvDy *local_2f8;
  MthdSifmSrcSize *local_2f0;
  MthdDvdSrcFormat *local_2e8;
  MthdSifmOffset *local_2e0;
  MthdSifmSrcPos *local_2d8;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_410 = (MthdNop *)operator_new(0x25950);
  this_04 = &(this->super_Class).rnd;
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_04);
  std::__cxx11::string::string((string *)&local_3a8,"nop",&local_479);
  pMVar8 = local_410;
  opt = &(this->super_Class).opt;
  MthdNop::SingleMthdTest
            (local_410,opt,(uint32_t)rVar9,&local_3a8,-1,(this->super_Class).cls,0x100,1,4);
  local_388._M_dataplus._M_p = (pointer)pMVar8;
  local_418 = (MthdNotify *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_04);
  local_478 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_3c8,"notify",&local_47a);
  pMVar7 = local_418;
  MthdNotify::SingleMthdTest
            (local_418,opt,(uint32_t)rVar9,&local_3c8,0,(this->super_Class).cls,0x104,1,4);
  local_388._M_string_length = (size_type)pMVar7;
  this_00 = (MthdPmTrigger *)operator_new(0x25950);
  local_3d0 = this_00;
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_04);
  std::__cxx11::string::string((string *)&local_50,"pm_trigger",&local_47b);
  MthdPmTrigger::SingleMthdTest
            (this_00,opt,(uint32_t)rVar9,&local_50,-1,(this->super_Class).cls,0x140,1,4);
  local_388.field_2._M_allocated_capacity = (size_type)this_00;
  local_420 = (MthdDmaNotify *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_04);
  std::__cxx11::string::string((string *)&local_70,"dma_notify",&local_47c);
  pMVar6 = local_420;
  MthdDmaNotify::SingleMthdTest
            (local_420,opt,(uint32_t)rVar9,&local_70,1,(this->super_Class).cls,0x180,1,4);
  local_388.field_2._8_8_ = pMVar6;
  pMVar10 = (MthdDmaGrobj *)operator_new(0x25960);
  local_3d8 = pMVar10;
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_04);
  std::__cxx11::string::string((string *)&local_90,"dma_ov",&local_47d);
  MthdDmaGrobj::MthdDmaGrobj
            (pMVar10,opt,(uint32_t)rVar9,&local_90,2,(this->super_Class).cls,0x184,1,0);
  local_368 = pMVar10;
  local_428 = (MthdDmaGrobj *)operator_new(0x25960);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_04);
  std::__cxx11::string::string((string *)&local_b0,"dma_src",&local_47e);
  pMVar10 = local_428;
  MthdDmaGrobj::MthdDmaGrobj
            (local_428,opt,(uint32_t)rVar9,&local_b0,3,(this->super_Class).cls,0x188,0,0);
  local_360 = pMVar10;
  this_01 = (MthdDmaSurf *)operator_new(0x25958);
  local_3e0 = this_01;
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_04);
  std::__cxx11::string::string((string *)&local_d0,"dma_surf",&local_47f);
  uVar16 = (this->super_Class).cls;
  MthdDmaSurf::MthdDmaSurf
            (this_01,opt,(uint32_t)rVar9,&local_d0,4,uVar16,0x18c,4,(uVar16 == 0x88) + 1);
  local_358 = this_01;
  local_430 = (MthdSifmXy *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_04);
  uVar16 = 0x1c693c;
  std::__cxx11::string::string((string *)&local_f0,"xy",&local_480);
  pMVar5 = local_430;
  anon_unknown_5::MthdSifmXy::SingleMthdTest
            (local_430,opt,(uint32_t)rVar9,&local_f0,5,(this->super_Class).cls,0x300,uVar16,
             (uint32_t)this_04);
  local_350 = pMVar5;
  this_02 = (MthdSifmRect *)operator_new(0x25950);
  local_3e8 = this_02;
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_04);
  uVar16 = 0x1c69b5;
  std::__cxx11::string::string((string *)&local_110,"rect",&local_481);
  anon_unknown_5::MthdSifmRect::SingleMthdTest
            (this_02,opt,(uint32_t)rVar9,&local_110,6,(this->super_Class).cls,0x304,uVar16,
             (uint32_t)this_04);
  local_348 = this_02;
  local_438 = (SingleMthdTest *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_04);
  std::__cxx11::string::string((string *)&local_130,"surf_format",&local_482);
  pSVar4 = local_438;
  pgraph::SingleMthdTest::SingleMthdTest
            (local_438,opt,(uint32_t)rVar9,&local_130,7,(this->super_Class).cls,0x308,1,4);
  (pSVar4->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_003141e0;
  local_340 = pSVar4;
  local_440 = (MthdSurfOffset *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_04);
  std::__cxx11::string::string((string *)&local_150,"surf_offset",&local_483);
  pMVar3 = local_440;
  uVar16 = (this->super_Class).cls;
  MthdSurfOffset::MthdSurfOffset
            (local_440,opt,(uint32_t)rVar9,&local_150,8,uVar16,0x30c,4,(uVar16 == 0x88) + 1);
  local_338 = pMVar3;
  local_448 = (MthdSifmDuDx *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_04);
  std::__cxx11::string::string((string *)&local_170,"src.dudx",&local_484);
  pMVar13 = local_448;
  anon_unknown_5::MthdSifmDuDx::MthdSifmDuDx
            (local_448,opt,(uint32_t)rVar9,&local_170,9,(this->super_Class).cls,0x310,0);
  local_330 = pMVar13;
  local_450 = (MthdSifmDvDy *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_04);
  std::__cxx11::string::string((string *)&local_190,"src.dvdy",&local_485);
  pMVar2 = local_450;
  anon_unknown_5::MthdSifmDvDy::MthdSifmDvDy
            (local_450,opt,(uint32_t)rVar9,&local_190,10,(this->super_Class).cls,0x314,0);
  local_328 = pMVar2;
  pMVar11 = (MthdSifmSrcSize *)operator_new(0x25958);
  local_3f0 = pMVar11;
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_04);
  std::__cxx11::string::string((string *)&local_1b0,"src.size",&local_486);
  anon_unknown_5::MthdSifmSrcSize::MthdSifmSrcSize
            (pMVar11,opt,(uint32_t)rVar9,&local_1b0,0xb,(this->super_Class).cls,0x318,0);
  local_320 = pMVar11;
  local_458 = (MthdDvdSrcFormat *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_04);
  std::__cxx11::string::string((string *)&local_1d0,"src.format",&local_487);
  pMVar1 = local_458;
  anon_unknown_5::MthdDvdSrcFormat::MthdDvdSrcFormat
            (local_458,opt,(uint32_t)rVar9,&local_1d0,0xc,(this->super_Class).cls,0x31c,0);
  local_318 = pMVar1;
  pMVar12 = (MthdSifmOffset *)operator_new(0x25958);
  local_3f8 = pMVar12;
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_04);
  std::__cxx11::string::string((string *)&local_1f0,"src.offset",&local_488);
  anon_unknown_5::MthdSifmOffset::MthdSifmOffset
            (pMVar12,opt,(uint32_t)rVar9,&local_1f0,0xd,(this->super_Class).cls,800,0);
  local_310 = pMVar12;
  local_460 = (MthdSifmSrcPos *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_04);
  std::__cxx11::string::string((string *)&local_210,"src.pos",&local_489);
  pMVar14 = local_460;
  anon_unknown_5::MthdSifmSrcPos::MthdSifmSrcPos
            (local_460,opt,(uint32_t)rVar9,&local_210,0xe,(this->super_Class).cls,0x324,0,false);
  local_308 = pMVar14;
  pMVar13 = (MthdSifmDuDx *)operator_new(0x25958);
  local_400 = pMVar13;
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_04);
  std::__cxx11::string::string((string *)&local_230,"ov.dudx",&local_48a);
  anon_unknown_5::MthdSifmDuDx::MthdSifmDuDx
            (pMVar13,opt,(uint32_t)rVar9,&local_230,0xf,(this->super_Class).cls,0x328,1);
  local_300 = pMVar13;
  local_468 = (MthdSifmDvDy *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_04);
  std::__cxx11::string::string((string *)&local_250,"ov.dvdy",&local_48b);
  pMVar2 = local_468;
  anon_unknown_5::MthdSifmDvDy::MthdSifmDvDy
            (local_468,opt,(uint32_t)rVar9,&local_250,0x10,(this->super_Class).cls,0x32c,1);
  local_2f8 = pMVar2;
  pMVar11 = (MthdSifmSrcSize *)operator_new(0x25958);
  local_408 = pMVar11;
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_04);
  std::__cxx11::string::string((string *)&local_270,"ov.size",&local_48c);
  anon_unknown_5::MthdSifmSrcSize::MthdSifmSrcSize
            (pMVar11,opt,(uint32_t)rVar9,&local_270,0x11,(this->super_Class).cls,0x330,1);
  local_2f0 = pMVar11;
  local_470 = (MthdDvdSrcFormat *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_04);
  std::__cxx11::string::string((string *)&local_290,"ov.format",&local_48d);
  pMVar1 = local_470;
  anon_unknown_5::MthdDvdSrcFormat::MthdDvdSrcFormat
            (local_470,opt,(uint32_t)rVar9,&local_290,0x12,(this->super_Class).cls,0x334,1);
  local_2e8 = pMVar1;
  pMVar12 = (MthdSifmOffset *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_04);
  std::__cxx11::string::string((string *)&local_2b0,"ov.offset",&local_48e);
  anon_unknown_5::MthdSifmOffset::MthdSifmOffset
            (pMVar12,opt,(uint32_t)rVar9,&local_2b0,0x13,(this->super_Class).cls,0x338,1);
  local_2e0 = pMVar12;
  pMVar14 = (MthdSifmSrcPos *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_04);
  std::__cxx11::string::string((string *)&local_2d0,"ov.pos",&local_48f);
  anon_unknown_5::MthdSifmSrcPos::MthdSifmSrcPos
            (pMVar14,opt,(uint32_t)rVar9,&local_2d0,0x14,(this->super_Class).cls,0x33c,1,true);
  pvVar15 = local_478;
  __l._M_len = 0x17;
  __l._M_array = (iterator)&local_388;
  local_2d8 = pMVar14;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_478,__l,&local_490);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3a8);
  if ((char)(this->super_Class).cls == -0x78) {
    __position._M_current =
         (pvVar15->
         super__Vector_base<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
         )._M_impl.super__Vector_impl_data._M_start;
    this_03 = (MthdSync *)operator_new(0x25950);
    rVar9 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_04);
    std::__cxx11::string::string((string *)&local_388,"sync",(allocator *)&local_3c8);
    MthdSync::SingleMthdTest
              (this_03,opt,(uint32_t)rVar9,&local_388,-1,(this->super_Class).cls,0x108,1,4);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_3a8;
    local_3a8._M_dataplus._M_p = (pointer)this_03;
    std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
    ::insert(local_478,__position,__l_00);
    std::__cxx11::string::~string((string *)&local_388);
    pvVar15 = local_478;
  }
  return pvVar15;
}

Assistant:

std::vector<SingleMthdTest *> Dvd::mthds() {
	std::vector<SingleMthdTest *> res = {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_ov", 2, cls, 0x184, 1, DMA_R),
		new MthdDmaGrobj(opt, rnd(), "dma_src", 3, cls, 0x188, 0, DMA_R),
		new MthdDmaSurf(opt, rnd(), "dma_surf", 4, cls, 0x18c, 4, cls == 0x88 ? SURF_NV10 : SURF_NV4),
		new MthdSifmXy(opt, rnd(), "xy", 5, cls, 0x300),
		new MthdSifmRect(opt, rnd(), "rect", 6, cls, 0x304),
		new MthdSurfDvdFormat(opt, rnd(), "surf_format", 7, cls, 0x308),
		new MthdSurfOffset(opt, rnd(), "surf_offset", 8, cls, 0x30c, 4, cls == 0x88 ? SURF_NV10 : SURF_NV4),
		new MthdSifmDuDx(opt, rnd(), "src.dudx", 9, cls, 0x310, 0),
		new MthdSifmDvDy(opt, rnd(), "src.dvdy", 10, cls, 0x314, 0),
		new MthdSifmSrcSize(opt, rnd(), "src.size", 11, cls, 0x318, 0),
		new MthdDvdSrcFormat(opt, rnd(), "src.format", 12, cls, 0x31c, 0),
		new MthdSifmOffset(opt, rnd(), "src.offset", 13, cls, 0x320, 0),
		new MthdSifmSrcPos(opt, rnd(), "src.pos", 14, cls, 0x324, 0, false),
		new MthdSifmDuDx(opt, rnd(), "ov.dudx", 15, cls, 0x328, 1),
		new MthdSifmDvDy(opt, rnd(), "ov.dvdy", 16, cls, 0x32c, 1),
		new MthdSifmSrcSize(opt, rnd(), "ov.size", 17, cls, 0x330, 1),
		new MthdDvdSrcFormat(opt, rnd(), "ov.format", 18, cls, 0x334, 1),
		new MthdSifmOffset(opt, rnd(), "ov.offset", 19, cls, 0x338, 1),
		new MthdSifmSrcPos(opt, rnd(), "ov.pos", 20, cls, 0x33c, 1, true),
	};
	if ((cls & 0xff) == 0x88) {
		res.insert(res.begin(), {
			new MthdSync(opt, rnd(), "sync", -1, cls, 0x108),
		});
	}
	return res;
}